

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateMapEntry
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Label LVar5;
  Type TVar6;
  string *psVar7;
  string *input;
  Descriptor *pDVar8;
  Descriptor *pDVar9;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  EnumDescriptor *this_02;
  EnumValueDescriptor *this_03;
  bool bVar10;
  FieldDescriptor *value;
  FieldDescriptor *key;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Descriptor *local_30;
  Descriptor *message;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  message = (Descriptor *)proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  local_30 = FieldDescriptor::message_type(field);
  iVar4 = Descriptor::extension_count(local_30);
  bVar2 = false;
  bVar1 = false;
  bVar10 = true;
  if (iVar4 == 0) {
    LVar5 = FieldDescriptor::label((FieldDescriptor *)proto_local);
    bVar10 = true;
    if (LVar5 == LABEL_REPEATED) {
      iVar4 = Descriptor::extension_range_count(local_30);
      bVar10 = true;
      if (iVar4 == 0) {
        iVar4 = Descriptor::nested_type_count(local_30);
        bVar10 = true;
        if (iVar4 == 0) {
          iVar4 = Descriptor::enum_type_count(local_30);
          bVar10 = true;
          if (iVar4 == 0) {
            iVar4 = Descriptor::field_count(local_30);
            bVar10 = true;
            if (iVar4 == 2) {
              psVar7 = Descriptor::name_abi_cxx11_(local_30);
              input = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)proto_local);
              anon_unknown_1::ToCamelCase(&local_70,input,false);
              bVar2 = true;
              std::operator+(&local_50,&local_70,"Entry");
              bVar1 = true;
              bVar3 = std::operator!=(psVar7,&local_50);
              bVar10 = true;
              if (!bVar3) {
                pDVar8 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
                pDVar9 = Descriptor::containing_type(local_30);
                bVar10 = pDVar8 != pDVar9;
              }
            }
          }
        }
      }
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (bVar10) {
    return false;
  }
  this_00 = Descriptor::field(local_30,0);
  this_01 = Descriptor::field(local_30,1);
  LVar5 = FieldDescriptor::label(this_00);
  if ((LVar5 != LABEL_OPTIONAL) || (iVar4 = FieldDescriptor::number(this_00), iVar4 != 1)) {
    return false;
  }
  psVar7 = FieldDescriptor::name_abi_cxx11_(this_00);
  bVar10 = std::operator!=(psVar7,"key");
  if (bVar10) {
    return false;
  }
  LVar5 = FieldDescriptor::label(this_01);
  if ((LVar5 != LABEL_OPTIONAL) || (iVar4 = FieldDescriptor::number(this_01), iVar4 != 2)) {
    return false;
  }
  psVar7 = FieldDescriptor::name_abi_cxx11_(this_01);
  bVar10 = std::operator!=(psVar7,"value");
  if (bVar10) {
    return false;
  }
  TVar6 = FieldDescriptor::type(this_00);
  if (1 < TVar6 - TYPE_DOUBLE) {
    if (TVar6 - TYPE_INT64 < 7) goto LAB_004eac03;
    if (2 < TVar6 - TYPE_GROUP) {
      if ((TVar6 != TYPE_UINT32) && (TVar6 == TYPE_ENUM)) {
        psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
        AddError(this,psVar7,(Message *)message,TYPE,"Key in map fields cannot be enum types.");
      }
      goto LAB_004eac03;
    }
  }
  psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
  AddError(this,psVar7,(Message *)message,TYPE,
           "Key in map fields cannot be float/double, bytes or message types.");
LAB_004eac03:
  TVar6 = FieldDescriptor::type(this_01);
  if (TVar6 == TYPE_ENUM) {
    this_02 = FieldDescriptor::enum_type(this_01);
    this_03 = EnumDescriptor::value(this_02,0);
    iVar4 = EnumValueDescriptor::number(this_03);
    if (iVar4 != 0) {
      psVar7 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      AddError(this,psVar7,(Message *)message,TYPE,
               "Enum value in map must define 0 as the first value.");
    }
  }
  return true;
}

Assistant:

bool DescriptorBuilder::ValidateMapEntry(FieldDescriptor* field,
                                         const FieldDescriptorProto& proto) {
  const Descriptor* message = field->message_type();
  if (// Must not contain extensions, extension range or nested message or
      // enums
      message->extension_count() != 0 ||
      field->label() != FieldDescriptor::LABEL_REPEATED ||
      message->extension_range_count() != 0 ||
      message->nested_type_count() != 0 || message->enum_type_count() != 0 ||
      // Must contain exactly two fields
      message->field_count() != 2 ||
      // Field name and message name must match
      message->name() != ToCamelCase(field->name(), false) + "Entry" ||
      // Entry message must be in the same containing type of the field.
      field->containing_type() != message->containing_type()) {
    return false;
  }

  const FieldDescriptor* key = message->field(0);
  const FieldDescriptor* value = message->field(1);
  if (key->label() != FieldDescriptor::LABEL_OPTIONAL || key->number() != 1 ||
      key->name() != "key") {
    return false;
  }
  if (value->label() != FieldDescriptor::LABEL_OPTIONAL ||
      value->number() != 2 || value->name() != "value") {
    return false;
  }

  // Check key types are legal.
  switch (key->type()) {
    case FieldDescriptor::TYPE_ENUM:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be enum types.");
      break;
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_BYTES:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be float/double, bytes or message types.");
      break;
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
      // Legal cases
      break;
    // Do not add a default, so that the compiler will complain when new types
    // are added.
  }

  if (value->type() == FieldDescriptor::TYPE_ENUM) {
    if (value->enum_type()->value(0)->number() != 0) {
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Enum value in map must define 0 as the first value.");
    }
  }

  return true;
}